

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O1

ModuleInfo * __thiscall ComponentManager::getModInfo(ComponentManager *this,char *name)

{
  Node *pNVar1;
  Node *pNVar2;
  long *__s1;
  int iVar3;
  ModuleInfo *pMVar4;
  allocator<char> local_81;
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60;
  size_t local_58;
  long local_50 [2];
  undefined8 local_40;
  undefined8 uStack_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,name,&local_81);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_80,local_78 + (long)local_80);
  local_40 = 0;
  uStack_38 = 0;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  __s1 = local_60;
  pNVar1 = (this->mModules).mTail;
  for (pNVar2 = ((this->mModules).mHead)->next; pNVar2 != pNVar1; pNVar2 = pNVar2->next) {
    pMVar4 = pNVar2->val;
    if ((local_58 == (pMVar4->mName)._M_string_length) &&
       ((local_58 == 0 || (iVar3 = bcmp(__s1,(pMVar4->mName)._M_dataplus._M_p,local_58), iVar3 == 0)
        ))) goto LAB_00102765;
  }
  pMVar4 = (ModuleInfo *)0x0;
LAB_00102765:
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return pMVar4;
}

Assistant:

ComponentManager::ModuleInfo *ComponentManager::getModInfo( const char *name )
{
	ModuleInfo match( name );

	for (JetHead::list<ModuleInfo*>::iterator i = mModules.begin(); 
		 i != mModules.end(); ++i)
	{
		if (*(*i) == match)
			return *i;
	}
	
	return NULL;
}